

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseStringCharRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  char *msg;
  byte bVar1;
  uint uVar2;
  long lVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  uint int1;
  
  if (str == (xmlChar **)0x0) {
    return 0;
  }
  pxVar4 = *str;
  if (pxVar4 == (xmlChar *)0x0) {
    return 0;
  }
  if ((*pxVar4 != '&') || (pxVar4[1] != '#')) {
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
    return 0;
  }
  pxVar5 = pxVar4 + 2;
  bVar1 = pxVar4[2];
  lVar3 = 1;
  if (bVar1 == 0x3b) {
LAB_0013e75a:
    int1 = 0;
  }
  else {
    if (bVar1 == 0x78) {
      bVar1 = pxVar4[3];
      pxVar4 = pxVar4 + 3;
      int1 = 0;
      lVar3 = 1;
      if (bVar1 != 0x3b) {
        int1 = 0;
        do {
          uVar2 = (uint)bVar1;
          if ((byte)(bVar1 - 0x30) < 10) {
            int1 = (int1 * 0x10 + uVar2) - 0x30;
          }
          else if ((byte)(bVar1 + 0x9f) < 6) {
            int1 = (int1 * 0x10 + uVar2) - 0x57;
          }
          else {
            if (5 < (byte)(bVar1 + 0xbf)) {
              lVar3 = 0;
              xmlFatalErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,(char *)0x0);
              int1 = 0;
              break;
            }
            int1 = (int1 * 0x10 + uVar2) - 0x37;
          }
          if (0x10ffff < (int)int1) {
            int1 = 0x110000;
          }
          bVar1 = pxVar4[1];
          pxVar4 = pxVar4 + 1;
        } while (bVar1 != 0x3b);
      }
      pxVar4 = pxVar4 + lVar3;
      goto LAB_0013e77d;
    }
    int1 = 0;
    do {
      if (9 < (byte)(bVar1 - 0x30)) {
        lVar3 = 0;
        xmlFatalErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,(char *)0x0);
        goto LAB_0013e75a;
      }
      int1 = ((uint)bVar1 + int1 * 10) - 0x30;
      if (0x10ffff < (int)int1) {
        int1 = 0x110000;
      }
      bVar1 = pxVar5[1];
      pxVar5 = pxVar5 + 1;
    } while (bVar1 != 0x3b);
  }
  pxVar4 = pxVar5 + lVar3;
LAB_0013e77d:
  *str = pxVar4;
  if ((int)int1 < 0x110000) {
    if ((int)int1 < 0x100) {
      if (0x1f < (int)int1) {
        return int1;
      }
      if ((int1 < 0xe) && ((0x2600U >> (int1 & 0x1f) & 1) != 0)) {
        return int1;
      }
    }
    else if (int1 - 0x10000 < 0xffffd800 || int1 - 0xe000 < 0x1ffe) {
      return int1;
    }
    msg = "xmlParseStringCharRef: invalid xmlChar value %d\n";
  }
  else {
    msg = "xmlParseStringCharRef: character reference out of bounds\n";
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
             (xmlChar *)0x0,(xmlChar *)0x0,int1,msg,int1);
  return 0;
}

Assistant:

static int
xmlParseStringCharRef(xmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *ptr;
    xmlChar cur;
    int val = 0;

    if ((str == NULL) || (*str == NULL)) return(0);
    ptr = *str;
    cur = *ptr;
    if ((cur == '&') && (ptr[1] == '#') && (ptr[2] == 'x')) {
	ptr += 3;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loop */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 16 + (cur - '0');
	    else if ((cur >= 'a') && (cur <= 'f'))
	        val = val * 16 + (cur - 'a') + 10;
	    else if ((cur >= 'A') && (cur <= 'F'))
	        val = val * 16 + (cur - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else if  ((cur == '&') && (ptr[1] == '#')){
	ptr += 2;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loops */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 10 + (cur - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else {
	xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
	return(0);
    }
    *str = ptr;

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseStringCharRef: character reference out of bounds\n",
                val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
			  "xmlParseStringCharRef: invalid xmlChar value %d\n",
			  val);
    }
    return(0);
}